

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu_parser.cc
# Opt level: O0

void aom_tools::anon_unknown_0::PrintObuHeader(ObuHeader *header)

{
  char *pcVar1;
  char *pcVar2;
  long in_RDI;
  
  pcVar1 = aom_obu_type_to_string(*(OBU_TYPE *)(in_RDI + 8));
  pcVar2 = "no";
  if (*(int *)(in_RDI + 0x10) != 0) {
    pcVar2 = "yes";
  }
  printf("  OBU type:        %s\n      extension:   %s\n",pcVar1,pcVar2);
  if (*(int *)(in_RDI + 0x10) != 0) {
    printf("      temporal_id: %d\n      spatial_id:  %d\n",(ulong)*(uint *)(in_RDI + 0x14),
           (ulong)*(uint *)(in_RDI + 0x18));
  }
  return;
}

Assistant:

void PrintObuHeader(const ObuHeader *header) {
  printf(
      "  OBU type:        %s\n"
      "      extension:   %s\n",
      aom_obu_type_to_string(static_cast<OBU_TYPE>(header->type)),
      header->has_extension ? "yes" : "no");
  if (header->has_extension) {
    printf(
        "      temporal_id: %d\n"
        "      spatial_id:  %d\n",
        header->temporal_layer_id, header->spatial_layer_id);
  }
}